

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRefining.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_208::GlobalRefining::run::GetUpdater::~GetUpdater(GetUpdater *this)

{
  GetUpdater *this_local;
  
  ~GetUpdater(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }